

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_compress.c
# Opt level: O1

_Bool do_end_block_check(block_split_stats *stats,u32 block_length)

{
  int *piVar1;
  u32 uVar2;
  int iVar3;
  long lVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  
  uVar2 = stats->num_observations;
  if (uVar2 != 0) {
    iVar3 = 0;
    lVar4 = -10;
    do {
      uVar5 = stats->observations[lVar4 + 10] * stats->num_new_observations;
      uVar7 = stats->observations[lVar4] * uVar2;
      iVar6 = uVar5 - uVar7;
      if (uVar5 < uVar7) {
        iVar6 = -(uVar5 - uVar7);
      }
      iVar3 = iVar3 + iVar6;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0);
    uVar7 = stats->num_new_observations + uVar2;
    uVar5 = (stats->num_new_observations * 200 >> 9) * uVar2;
    if (uVar7 < 0x2000 && block_length < 10000) {
      uVar5 = (int)((ulong)(0x2000 - uVar7) * (ulong)uVar5 >> 0xd) + uVar5;
    }
    if (uVar5 <= iVar3 + uVar2 * (block_length >> 0xc)) {
      return true;
    }
  }
  lVar4 = -0x28;
  do {
    piVar1 = (int *)((long)stats->observations + lVar4 + 0x28);
    *piVar1 = *piVar1 + *(int *)((long)stats->observations + lVar4);
    *(undefined4 *)((long)stats->observations + lVar4) = 0;
    lVar4 = lVar4 + 4;
  } while (lVar4 != 0);
  stats->num_observations = stats->num_observations + stats->num_new_observations;
  stats->num_new_observations = 0;
  return false;
}

Assistant:

static bool
do_end_block_check(struct block_split_stats *stats, u32 block_length)
{
	if (stats->num_observations > 0) {
		/*
		 * Compute the sum of absolute differences of probabilities.  To
		 * avoid needing to use floating point arithmetic or do slow
		 * divisions, we do all arithmetic with the probabilities
		 * multiplied by num_observations * num_new_observations.  E.g.,
		 * for the "old" observations the probabilities would be
		 * (double)observations[i] / num_observations, but since we
		 * multiply by both num_observations and num_new_observations we
		 * really do observations[i] * num_new_observations.
		 */
		u32 total_delta = 0;
		u32 num_items;
		u32 cutoff;
		int i;

		for (i = 0; i < NUM_OBSERVATION_TYPES; i++) {
			u32 expected = stats->observations[i] *
				       stats->num_new_observations;
			u32 actual = stats->new_observations[i] *
				     stats->num_observations;
			u32 delta = (actual > expected) ? actual - expected :
							  expected - actual;

			total_delta += delta;
		}

		num_items = stats->num_observations +
			    stats->num_new_observations;
		/*
		 * Heuristic: the cutoff is when the sum of absolute differences
		 * of probabilities becomes at least 200/512.  As above, the
		 * probability is multiplied by both num_new_observations and
		 * num_observations.  Be careful to avoid integer overflow.
		 */
		cutoff = stats->num_new_observations * 200 / 512 *
			 stats->num_observations;
		/*
		 * Very short blocks have a lot of overhead for the Huffman
		 * codes, so only use them if it clearly seems worthwhile.
		 * (This is an additional penalty, which adds to the smaller
		 * penalty below which scales more slowly.)
		 */
		if (block_length < 10000 && num_items < 8192)
			cutoff += (u64)cutoff * (8192 - num_items) / 8192;

		/* Ready to end the block? */
		if (total_delta +
		    (block_length / 4096) * stats->num_observations >= cutoff)
			return true;
	}
	merge_new_observations(stats);
	return false;
}